

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O1

bool absl::debugging_internal::ParseName(State *state)

{
  undefined1 *puVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  undefined4 uVar6;
  bool bVar7;
  bool bVar8;
  ComplexityGuard guard;
  ParseState copy;
  
  iVar2 = state->recursion_depth;
  iVar3 = state->steps;
  state->recursion_depth = iVar2 + 1;
  state->steps = iVar3 + 1;
  if (0x1ffff < iVar3 || 0xff < iVar2) {
    bVar8 = false;
    goto LAB_00276d6d;
  }
  state->recursion_depth = iVar2 + 2;
  state->steps = iVar3 + 2;
  if (iVar3 < 0x1ffff && iVar2 < 0xff) {
    iVar2 = (state->parse_state).prev_name_idx;
    iVar3 = (state->parse_state).mangled_idx;
    iVar5 = (state->parse_state).out_cur_idx;
    uVar4 = *(uint *)&(state->parse_state).field_0xc;
    bVar7 = ParseOneCharToken(state,'N');
    if (!bVar7) {
LAB_00276c86:
      (state->parse_state).prev_name_idx = iVar2;
      (state->parse_state).mangled_idx = iVar3;
      (state->parse_state).out_cur_idx = iVar5;
      *(uint *)&(state->parse_state).field_0xc = uVar4;
      goto LAB_00276c9b;
    }
    puVar1 = &(state->parse_state).field_0xc;
    *(uint *)puVar1 = *(uint *)puVar1 & 0x8000ffff;
    ParseCVQualifiers(state);
    ParseCharClass(state,"OR");
    bVar7 = ParsePrefix(state);
    if (!bVar7) goto LAB_00276c86;
    *(uint *)&(state->parse_state).field_0xc =
         *(uint *)&(state->parse_state).field_0xc & 0x8000ffff | uVar4 & 0x7fff0000;
    bVar8 = ParseOneCharToken(state,'E');
    bVar7 = true;
    if (!bVar8) goto LAB_00276c86;
  }
  else {
LAB_00276c9b:
    bVar7 = false;
  }
  iVar2 = state->recursion_depth;
  state->recursion_depth = iVar2 + -1;
  bVar8 = true;
  if (!bVar7) {
    state->recursion_depth = iVar2;
    iVar3 = state->steps;
    state->steps = iVar3 + 1;
    if (iVar3 < 0x20000 && iVar2 < 0x101) {
      iVar2 = (state->parse_state).mangled_idx;
      iVar3 = (state->parse_state).out_cur_idx;
      iVar5 = (state->parse_state).prev_name_idx;
      uVar6 = *(undefined4 *)&(state->parse_state).field_0xc;
      bVar7 = ParseOneCharToken(state,'Z');
      if (bVar7) {
        bVar7 = ParseEncoding(state);
        if (bVar7) {
          bVar7 = ParseOneCharToken(state,'E');
          if (bVar7) {
            bVar7 = ParseLocalNameSuffix(state);
            if (bVar7) {
              state->recursion_depth = state->recursion_depth + -1;
              goto LAB_00276d6d;
            }
          }
        }
      }
      (state->parse_state).mangled_idx = iVar2;
      (state->parse_state).out_cur_idx = iVar3;
      (state->parse_state).prev_name_idx = iVar5;
      *(undefined4 *)&(state->parse_state).field_0xc = uVar6;
    }
    state->recursion_depth = state->recursion_depth + -1;
    iVar2 = (state->parse_state).mangled_idx;
    iVar3 = (state->parse_state).out_cur_idx;
    iVar5 = (state->parse_state).prev_name_idx;
    uVar6 = *(undefined4 *)&(state->parse_state).field_0xc;
    bVar7 = ParseSubstitution(state,false);
    if (bVar7) {
      bVar7 = ParseTemplateArgs(state);
      bVar8 = true;
      if (bVar7) goto LAB_00276d6d;
    }
    (state->parse_state).mangled_idx = iVar2;
    (state->parse_state).out_cur_idx = iVar3;
    (state->parse_state).prev_name_idx = iVar5;
    *(undefined4 *)&(state->parse_state).field_0xc = uVar6;
    bVar8 = ParseUnscopedName(state);
    if (bVar8) {
      ParseTemplateArgs(state);
    }
  }
LAB_00276d6d:
  state->recursion_depth = state->recursion_depth + -1;
  return bVar8;
}

Assistant:

static bool ParseName(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  if (ParseNestedName(state) || ParseLocalName(state)) {
    return true;
  }

  // We reorganize the productions to avoid re-parsing unscoped names.
  // - Inline <unscoped-template-name> productions:
  //   <name> ::= <substitution> <template-args>
  //          ::= <unscoped-name> <template-args>
  //          ::= <unscoped-name>
  // - Merge the two productions that start with unscoped-name:
  //   <name> ::= <unscoped-name> [<template-args>]

  ParseState copy = state->parse_state;
  // "std<...>" isn't a valid name.
  if (ParseSubstitution(state, /*accept_std=*/false) &&
      ParseTemplateArgs(state)) {
    return true;
  }
  state->parse_state = copy;

  // Note there's no need to restore state after this since only the first
  // subparser can fail.
  return ParseUnscopedName(state) && Optional(ParseTemplateArgs(state));
}